

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSSerializerImpl.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::DOMLSSerializerImpl::reportError
          (DOMLSSerializerImpl *this,DOMNode *errorNode,ErrorSeverity errorType,XMLCh *errorMsg)

{
  undefined1 uVar1;
  DOMErrorImpl domError;
  DOMLocatorImpl locator;
  DOMErrorImpl local_88;
  DOMLocatorImpl local_58;
  
  if (this->fErrorHandler == (DOMErrorHandler *)0x0) {
    uVar1 = 1;
  }
  else {
    DOMLocatorImpl::DOMLocatorImpl
              (&local_58,0,0,errorNode,(XMLCh *)0x0,0xffffffffffffffff,0xffffffffffffffff);
    DOMErrorImpl::DOMErrorImpl(&local_88,errorType,errorMsg,&local_58.super_DOMLocator);
    uVar1 = (**(code **)(*(long *)this->fErrorHandler + 0x10))(this->fErrorHandler,&local_88);
    DOMErrorImpl::~DOMErrorImpl(&local_88);
    DOMLocatorImpl::~DOMLocatorImpl(&local_58);
  }
  if (errorType != DOM_SEVERITY_WARNING) {
    this->fErrorCount = this->fErrorCount + 1;
  }
  return (bool)uVar1;
}

Assistant:

bool DOMLSSerializerImpl::reportError(const DOMNode* const    errorNode
                              , DOMError::ErrorSeverity errorType
                              , const XMLCh*   const    errorMsg)
{
    bool toContinueProcess = true;   // default value for no error handler

    if (fErrorHandler)
    {
        DOMLocatorImpl  locator(0, 0, (DOMNode*) errorNode, 0);
        DOMErrorImpl    domError(errorType , errorMsg, &locator);
        try
        {
            toContinueProcess = fErrorHandler->handleError(domError);
        }
        catch(...)
        {
        }
    }

    if (errorType != DOMError::DOM_SEVERITY_WARNING)
        fErrorCount++;

    return toContinueProcess;
}